

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-inequalities-Z.cpp
# Opt level: O3

bool __thiscall
baryonyx::itm::
solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
::
compute_update_row<baryonyx::bit_array,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
          (solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
           *this,bit_array *x,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> first,
          __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last,longdouble kappa,
          longdouble delta,longdouble theta)

{
  solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>
  *reduced_cost;
  rc_data *prVar1;
  int k;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *plVar2;
  int *piVar3;
  bool bVar4;
  uint r_size;
  int selected;
  bool bVar5;
  row_iterator prVar6;
  __uniq_ptr_impl<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
  _Var7;
  rc_data *prVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  int iVar12;
  ulong uVar13;
  rc_data *ret_1;
  long lVar14;
  rc_data *prVar15;
  rc_data *ret;
  int iVar16;
  string_view fmt;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  undefined1 local_78 [16];
  longdouble local_68;
  longdouble local_58;
  longdouble local_48;
  
  local_48 = kappa;
  local_58 = delta;
  local_68 = theta;
  fmt._M_str = "update-row {} {} {}\n";
  fmt._M_len = 0x14;
  debug_logger<true>::log<long_double,long_double,long_double>
            ((debug_logger<true> *)this,fmt,&local_48,&local_58,&local_68);
  if (first._M_current == last._M_current) {
    bVar5 = false;
  }
  else {
    reduced_cost = this + 0x60;
    bVar5 = false;
    do {
      k = *first._M_current;
      sparse_matrix<int>::row((sparse_matrix<int> *)local_78,(int)this + 0x10);
      if (local_78._8_8_ != local_78._0_8_) {
        lVar14 = *(long *)(this + 0x50);
        prVar6 = (row_iterator)local_78._8_8_;
        do {
          piVar3 = &prVar6->value;
          prVar6 = prVar6 + 1;
          lVar11 = (long)*piVar3 * 0x10;
          *(longdouble *)(lVar14 + lVar11) = *(longdouble *)(lVar14 + lVar11) * local_68;
        } while (prVar6 != (row_iterator)local_78._0_8_);
      }
      lVar14 = (long)k;
      r_size = solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
               ::compute_reduced_costs<baryonyx::bit_array>
                         ((solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>
                           *)this,(row_iterator)local_78._8_8_,(row_iterator)local_78._0_8_,x);
      selected = -2;
      switch(*(undefined1 *)(*(long *)(this + 0x68) + lVar14)) {
      case 0:
        if (1 < (int)r_size) {
          lVar11 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        iVar9 = *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc);
        goto LAB_005f2f9c;
      case 2:
        if (1 < (int)r_size) {
          lVar11 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        iVar9 = *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc);
        iVar12 = *(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc);
        if (-1 < (int)r_size) {
          lVar14 = -1;
          iVar10 = 0;
          iVar16 = -2;
          do {
            selected = (int)lVar14;
            if (iVar12 < iVar10) {
              selected = iVar16;
            }
            if (iVar10 < iVar9) {
              selected = iVar16;
            }
            if (selected == -2) {
              if (lVar14 + 1U == (ulong)r_size) break;
            }
            else if (((longdouble)0 <
                      *(longdouble *)
                       ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                *)reduced_cost + 0x20 + lVar14 * 0x20)) ||
                    (lVar14 + 1U == (ulong)r_size)) goto switchD_005f2b5a_default;
            lVar14 = lVar14 + 1;
            iVar10 = iVar10 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0x14 + lVar14 * 0x20);
            iVar16 = selected;
          } while( true );
        }
LAB_005f2f9c:
        selected = branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                             ((branch_and_bound_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x80),
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size,iVar9,iVar12);
        break;
      case 3:
        if (1 < (int)r_size) {
          lVar11 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        if (-1 < (int)r_size) {
          lVar11 = -1;
          iVar12 = 0;
          iVar9 = -2;
          do {
            selected = (int)lVar11;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc) < iVar12) {
              selected = iVar9;
            }
            if (iVar12 < *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc)) {
              selected = iVar9;
            }
            if (selected == -2) {
              if (lVar11 + 1U == (ulong)r_size) break;
            }
            else if (((longdouble)0 <
                      *(longdouble *)
                       ((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                *)reduced_cost + 0x20 + lVar11 * 0x20)) ||
                    (lVar11 + 1U == (ulong)r_size)) goto switchD_005f2b5a_default;
            lVar11 = lVar11 + 1;
            iVar12 = iVar12 + *(int *)((long)*(__uniq_ptr_data<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>,_true,_true>
                                               *)reduced_cost + 0x14 + lVar11 * 0x20);
            iVar9 = selected;
          } while( true );
        }
      case 1:
        selected = exhaustive_solver<baryonyx::itm::minimize_tag,long_double>::
                   solve<std::unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[],std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data[]>>>
                             ((exhaustive_solver<baryonyx::itm::minimize_tag,long_double> *)
                              (this + 0x100),k,
                              (unique_ptr<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                               *)reduced_cost,r_size);
        break;
      case 4:
        if (1 < (int)r_size) {
          lVar11 = (long)(int)r_size;
          prVar15 = *(rc_data **)(this + 0x60);
          plVar2 = *(linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> **)
                    (this + 8);
          prVar1 = prVar15 + lVar11;
          std::
          __introsort_loop<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,long,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1,(int)LZCOUNT(lVar11) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,__gnu_cxx::__ops::_Iter_comp_iter<baryonyx::itm::calculator_sort<baryonyx::itm::minimize_tag,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*>(baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&)::_lambda(auto:1_const&,auto:2_const&)_1_>>
                    (prVar15,prVar1);
          lVar11 = lVar11 * 0x20 + -0x20;
          prVar8 = prVar15;
          do {
            prVar8 = prVar8 + 1;
            if ((prVar15->value != prVar8->value) || (NAN(prVar15->value) || NAN(prVar8->value))) {
              std::
              shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                        (prVar15,prVar8,plVar2);
              prVar15 = prVar8;
            }
            lVar11 = lVar11 + -0x20;
          } while (lVar11 != 0);
          std::
          shuffle<baryonyx::itm::solver_inequalities_Zcoeff<long_double,baryonyx::itm::minimize_tag,baryonyx::itm::default_cost_type<long_double>,true>::rc_data*,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>&>
                    (prVar15,prVar1,plVar2);
        }
        if (-1 < (int)r_size) {
          selected = -2;
          uVar13 = 0xffffffffffffffff;
          iVar9 = 0;
          _Var7._M_t.
          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
          .
          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
          ._M_head_impl =
               *(tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 *)reduced_cost;
          do {
            iVar12 = (int)uVar13;
            if (*(int *)(*(long *)(this + 0x70) + 4 + lVar14 * 0xc) < iVar9) {
              iVar12 = selected;
            }
            if (iVar9 < *(int *)(*(long *)(this + 0x70) + lVar14 * 0xc)) {
              iVar12 = selected;
            }
            selected = iVar12;
            if ((selected != -2) &&
               ((longdouble)0 <
                *(longdouble *)
                 _Var7._M_t.
                 super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                 .
                 super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                 ._M_head_impl)) break;
            iVar9 = iVar9 + *(int *)((long)_Var7._M_t.
                                           super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                                           .
                                           super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                                           ._M_head_impl + 0x14);
            uVar13 = uVar13 + 1;
            _Var7._M_t.
            super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
            .
            super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
            ._M_head_impl =
                 (tuple<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                  )((long)_Var7._M_t.
                          super__Tuple_impl<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_std::default_delete<baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data[]>_>
                          .
                          super__Head_base<0UL,_baryonyx::itm::solver_inequalities_Zcoeff<long_double,_baryonyx::itm::minimize_tag,_baryonyx::itm::default_cost_type<long_double>,_true>::rc_data_*,_false>
                          ._M_head_impl + 0x20);
          } while (r_size != uVar13);
        }
      }
switchD_005f2b5a_default:
      bVar4 = local_affect<baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*>
                        (this,x,(row_value *)local_78._8_8_,k,selected,r_size,local_48,local_58);
      first._M_current = first._M_current + 1;
      bVar5 = (bool)(bVar5 | bVar4);
    } while (first._M_current != last._M_current);
  }
  return bVar5;
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);
            const auto r_size =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            Float pi_change;
            int selected = -2;

            switch (Z[k]) {
            case subsolver_type::branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::exhaustive:
                selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::unconstrained_branch_and_bound:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = bb.solve(R, r_size, b[k].min, b[k].max);
                break;
            case subsolver_type::unconstrained_exhaustive:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables(r_size, b[k].min, b[k].max);
                if (selected == -2)
                    selected = ex.solve(k, R, r_size);
                break;
            case subsolver_type::linear:
                calculator_sort<Mode>(R.get(), R.get() + r_size, rng);
                selected = select_variables_101(r_size, b[k].min, b[k].max);
                break;
            }

            pi_change = local_affect(
              x, std::get<0>(it), k, selected, r_size, kappa, delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }